

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_TEST(void)

{
  byte bVar1;
  int local_18 [2];
  int e [4];
  
  if (DAT_001e16a8._4_4_ < 1) {
    Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  }
  else {
    local_18[0] = 0xed;
    local_18[1] = 0x27;
    bVar1 = GetByteNoMem(&::lp,false);
    e[0] = (int)bVar1;
    e[1] = -1;
    resolveRelocationAndSmartSmc(2,HIGH);
    EmitBytes(local_18,true);
  }
  return;
}

Assistant:

static void OpCode_Next_TEST() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		int e[] { 0xED, 0x27, GetByteNoMem(lp), -1 };
		resolveRelocationAndSmartSmc(2, Relocation::HIGH);
		EmitBytes(e, true);
	}